

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_error(json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,size_t param_1,string *param_2,exception *ex)

{
  int iVar1;
  parse_error *this_00;
  out_of_range *this_01;
  invalid_iterator *this_02;
  type_error *this_03;
  other_error *this_04;
  exception *ex_local;
  string *param_2_local;
  size_t param_1_local;
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  this->errored = true;
  if ((this->allow_exceptions & 1U) != 0) {
    iVar1 = ex->id / 100;
    switch(~((iVar1 / 100) * 100) + iVar1) {
    case 0:
      this_00 = (parse_error *)__cxa_allocate_exception(0x28);
      detail::parse_error::parse_error(this_00,(parse_error *)ex);
      __cxa_throw(this_00,&detail::parse_error::typeinfo,detail::parse_error::~parse_error);
    case 1:
      this_02 = (invalid_iterator *)__cxa_allocate_exception(0x20);
      invalid_iterator::invalid_iterator(this_02,(invalid_iterator *)ex);
      __cxa_throw(this_02,&invalid_iterator::typeinfo,invalid_iterator::~invalid_iterator);
    case 2:
      this_03 = (type_error *)__cxa_allocate_exception(0x20);
      type_error::type_error(this_03,(type_error *)ex);
      __cxa_throw(this_03,&type_error::typeinfo,type_error::~type_error);
    case 3:
      this_01 = (out_of_range *)__cxa_allocate_exception(0x20);
      out_of_range::out_of_range(this_01,(out_of_range *)ex);
      __cxa_throw(this_01,&out_of_range::typeinfo,out_of_range::~out_of_range);
    case 4:
      this_04 = (other_error *)__cxa_allocate_exception(0x20);
      other_error::other_error(this_04,(other_error *)ex);
      __cxa_throw(this_04,&other_error::typeinfo,other_error::~other_error);
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0xfc0,
                    "bool nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::parse_error(std::size_t, const std::string &, const detail::exception &) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
  }
  return false;
}

Assistant:

bool parse_error(std::size_t /*unused*/, const std::string& /*unused*/, const detail::exception& ex) {
		errored = true;
		if (allow_exceptions) {
			// determine the proper exception type from the id
			switch ((ex.id / 100) % 100) {
				case 1:
					JSON_THROW(*reinterpret_cast<const detail::parse_error*>(&ex));
				case 4:
					JSON_THROW(*reinterpret_cast<const detail::out_of_range*>(&ex));
				// LCOV_EXCL_START
				case 2:
					JSON_THROW(*reinterpret_cast<const detail::invalid_iterator*>(&ex));
				case 3:
					JSON_THROW(*reinterpret_cast<const detail::type_error*>(&ex));
				case 5:
					JSON_THROW(*reinterpret_cast<const detail::other_error*>(&ex));
				default:
					assert(false);
					// LCOV_EXCL_STOP
			}
		}
		return false;
	}